

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Plane1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi1,
          Matrix<float,_4,_1,_0,_4,_1> *Pi2,Matrix<float,_4,_1,_0,_4,_1> *Nu1,
          Matrix<float,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  float fVar1;
  iterator iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar6;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar7;
  long lVar8;
  ostream *poVar9;
  char *__function;
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pDVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_208;
  double local_1e8;
  uint uStack_1e0;
  uint uStack_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined8 local_1c8;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined1 local_198 [16];
  float local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float fStack_150;
  float local_14c;
  undefined8 local_148;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Matrix<float,_4,_4,_0,_4,_4> local_108;
  double local_c8;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_54 [9];
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar13 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  fVar11 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [1];
  fVar1 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  fVar18 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  local_188 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  fVar16 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  fVar17 = fVar1 * fVar1;
  fVar19 = fVar11 * fVar11;
  dVar22 = (double)(fVar19 + fVar17);
  local_78 = ZEXT416((uint)(fVar13 * fVar11));
  local_88 = ZEXT416((uint)(fVar13 * fVar1));
  local_198 = ZEXT416((uint)fVar11);
  dVar4 = (double)(fVar11 * fVar16 - local_188 * fVar1);
  local_138._0_4_ = fVar13 * fVar13;
  local_98 = ZEXT416((uint)fVar19);
  local_68 = ZEXT416((uint)fVar17);
  fVar20 = fVar13 * fVar13 + fVar19 + fVar17;
  local_1b8._0_4_ = fVar20;
  local_148 = (double)(((fVar19 * fVar18 + fVar17 * fVar18) - fVar13 * fVar11 * local_188) -
                      fVar13 * fVar1 * fVar16);
  local_1e8 = local_148 * local_148 * dVar22 + (double)fVar20 * dVar4 * dVar4 * dVar22;
  local_118 = ZEXT416((uint)fVar1);
  local_b8 = -0.0;
  uStack_b4 = 0x80000000;
  uStack_b0 = 0x80000000;
  uStack_ac = 0x80000000;
  local_1c8 = (double)CONCAT44(0x80000000,-fVar1);
  uStack_1c0 = 0x80000000;
  uStack_1bc = 0x80000000;
  local_1cc = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_170 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar11 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  local_128 = ZEXT416((uint)(Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                            m_storage.m_data.array[1]);
  local_a8 = ZEXT416((uint)(Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[2]);
  local_1d0 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar1 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar17 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [1];
  fVar19 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  local_174 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  dVar5 = SQRT(local_1e8);
  dVar3 = dVar5;
  if (local_1e8 < 0.0) {
    local_1a8 = dVar4;
    local_c8 = dVar5;
    dVar5 = sqrt(local_1e8);
    dVar4 = local_1a8;
    dVar3 = local_c8;
  }
  local_54[0] = (float)((1.0 / dVar5) * dVar4 * dVar22);
  pDVar10 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
  local_208.m_row = 0;
  local_208.m_col = 1;
  local_208.m_currentBlockRows = 1;
  local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar10;
  if (local_1e8 < 0.0) {
    dVar3 = sqrt(local_1e8);
  }
  local_1d4 = (float)((double)(fVar13 * fVar16 + fVar18 * (float)local_1c8) * (-1.0 / dVar3) *
                     dVar22);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_208,&local_1d4);
  if (local_1e8 < 0.0) {
    dVar5 = sqrt(local_1e8);
  }
  else {
    dVar5 = SQRT(local_1e8);
  }
  local_1d8 = (float)((double)(fVar13 * local_188 - fVar18 * (float)local_198._0_4_) * (1.0 / dVar5)
                     * dVar22);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_1d8);
  if (local_1e8 < 0.0) {
    dVar5 = sqrt(local_1e8);
  }
  else {
    dVar5 = SQRT(local_1e8);
  }
  fVar20 = SQRT((float)local_1b8._0_4_);
  local_1b8._0_4_ = fVar20;
  local_1a8 = (double)fVar20;
  local_158 = (float)((((-1.0 / dVar5) * dVar22) / local_1a8) * local_148);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_158);
  local_148._0_4_ = -(float)local_78._0_4_;
  uStack_140 = local_78._8_4_ ^ 0x80000000;
  uStack_13c = local_78._12_4_ ^ 0x80000000;
  if (local_1e8 < 0.0) {
    local_148 = (double)(local_78._0_8_ ^ 0x8000000080000000);
    dVar5 = sqrt(local_1e8);
  }
  else {
    dVar5 = SQRT(local_1e8);
  }
  fVar20 = (float)local_148 * fVar18;
  local_148._0_4_ = (float)local_198._0_4_ * (float)local_118._0_4_;
  local_148._4_4_ = local_198._4_4_;
  uStack_140 = local_198._8_4_;
  uStack_13c = local_198._12_4_;
  local_15c = (float)((double)((fVar20 + (float)local_138._0_4_ * local_188 +
                                         (float)local_68._0_4_ * local_188) -
                              (float)local_148 * fVar16) * (((-1.0 / dVar5) * dVar22) / local_1a8));
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_15c);
  dVar5 = local_1e8;
  if (local_1e8 < 0.0) {
    local_1e8 = (double)(local_88._0_8_ ^ 0x8000000080000000);
    local_c8 = (double)(CONCAT44(local_148._4_4_,(float)local_148) ^ 0x8000000080000000);
    uStack_1e0 = local_88._8_4_ ^ 0x80000000;
    uStack_1dc = local_88._12_4_ ^ 0x80000000;
    uStack_c0 = uStack_140 ^ 0x80000000;
    uStack_bc = uStack_13c ^ 0x80000000;
    dVar5 = sqrt(dVar5);
    fVar20 = local_1e8._0_4_;
    fVar12 = local_c8._0_4_;
  }
  else {
    dVar5 = SQRT(local_1e8);
    fVar20 = -(float)local_88._0_4_;
    fVar12 = -(float)local_148;
  }
  local_160 = (float)((double)(fVar12 * local_188 +
                              fVar20 * fVar18 +
                              (float)local_138._0_4_ * fVar16 + (float)local_98._0_4_ * fVar16) *
                     (((-1.0 / dVar5) * dVar22) / local_1a8));
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_160);
  local_164 = fVar13 / (float)local_1b8._0_4_;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_164);
  local_168 = (float)local_198._0_4_ / (float)local_1b8._0_4_;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar6,&local_168);
  local_16c = (float)local_118._0_4_ / (float)local_1b8._0_4_;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar6,&local_16c);
  if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
       (local_208.m_row + local_208.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_208.m_col == 3)) {
    dVar3 = -1.0 / local_1a8;
    fVar20 = (float)local_98._0_4_ * local_170;
    fVar12 = (float)local_138._0_4_ * local_170;
    fVar15 = local_170 * (float)local_68._0_4_;
    fVar13 = fVar13 * local_1cc;
    fVar14 = -(float)local_198._0_4_ * local_1cc * local_188;
    fVar21 = (float)local_1c8 * local_1cc;
    dVar5 = (double)((float)local_78._0_4_ * fVar18 * local_188);
    dVar4 = (double)((float)local_88._0_4_ * fVar18 * fVar16);
    dVar22 = (double)((float)local_148 * local_188 * fVar16);
    dVar5 = (((double)(local_188 * local_188 * (float)local_68._0_4_ +
                      fVar16 * fVar16 * (float)local_98._0_4_ +
                      fVar18 * fVar18 * (float)local_68._0_4_ +
                      (float)local_138._0_4_ * fVar16 * fVar16 +
                      (float)local_138._0_4_ * local_188 * local_188 +
                      (float)local_98._0_4_ * fVar18 * fVar18) - (dVar5 + dVar5)) - (dVar4 + dVar4))
            - (dVar22 + dVar22);
    local_208.m_row = 0;
    local_208.m_col = 1;
    local_208.m_currentBlockRows = 1;
    local_154 = 0.0;
    local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_154;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1d4 = (float)(((double)(fVar21 * fVar16 +
                                 fVar14 + ((fVar15 + fVar12 + fVar20) - fVar13 * fVar18)) * dVar3) /
                       dVar5);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_208,
                        &local_1d4);
    local_1d8 = local_1cc / (float)local_1b8._0_4_;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar7,&local_1d8);
    if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
         (local_208.m_row + local_208.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_208.m_col == 1)) {
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar8 = 0;
      do {
        *(undefined4 *)
         ((long)local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar8 + 8) = *(undefined4 *)(pDVar10 + 8);
        *(undefined8 *)
         ((long)local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar8) = *(undefined8 *)pDVar10;
        pDVar10 = pDVar10 + 0xc;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x30);
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_14c;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = fStack_150;
      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_154;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar9 = (ostream *)std::ostream::flush();
        poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                          &local_108);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar9 = (ostream *)std::ostream::flush();
        local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_108;
        local_208.m_row = (Index)&local_108;
        poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                           *)&local_208);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar2,&local_108);
      }
      else {
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 0xc) =
             local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._48_8_;
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xe) =
             CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf],
                      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xe]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 8) =
             local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._32_8_;
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 10) =
             local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._40_8_;
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 4) =
             CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5],
                      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) =
             local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._24_8_;
        *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array =
             CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1],
                      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0]);
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 2) =
             CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3],
                      local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2]);
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_198._0_4_ = (float)local_a8._0_4_ * (float)local_a8._0_4_;
      fVar13 = (float)local_128._0_4_ * (float)local_128._0_4_;
      dVar22 = (double)(fVar13 + (float)local_198._0_4_);
      local_1b8 = ZEXT416((uint)(fVar11 * (float)local_128._0_4_));
      local_138 = ZEXT416((uint)(fVar11 * (float)local_a8._0_4_));
      dVar23 = (double)(((fVar13 * fVar1 + (float)local_198._0_4_ * fVar1) -
                        fVar11 * (float)local_128._0_4_ * fVar17) -
                       fVar11 * (float)local_a8._0_4_ * fVar19);
      local_188 = -(float)local_a8._0_4_;
      uStack_184 = local_a8._4_4_ ^ 0x80000000;
      uStack_180 = local_a8._8_4_ ^ 0x80000000;
      uStack_17c = local_a8._12_4_ ^ 0x80000000;
      dVar4 = (double)((float)local_128._0_4_ * fVar19 - fVar17 * (float)local_a8._0_4_);
      fVar18 = fVar11 * fVar11;
      local_1a8 = (double)CONCAT44(local_128._4_4_,fVar13);
      uStack_1a0 = local_128._8_4_;
      uStack_19c = local_128._12_4_;
      local_198._4_4_ = local_a8._4_4_;
      local_198._8_4_ = local_a8._8_4_;
      local_198._12_4_ = local_a8._12_4_;
      fVar13 = fVar18 + fVar13 + (float)local_198._0_4_;
      local_1e8 = dVar23 * dVar23 * dVar22 + (double)fVar13 * dVar4 * dVar4 * dVar22;
      dVar5 = SQRT(local_1e8);
      dVar3 = dVar5;
      if (local_1e8 < 0.0) {
        local_118._0_8_ = dVar4;
        local_1c8 = dVar5;
        dVar5 = sqrt(local_1e8);
        dVar4 = (double)local_118._0_8_;
        dVar3 = local_1c8;
      }
      local_54[0] = (float)((1.0 / dVar5) * dVar4 * dVar22);
      pDVar10 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
      local_208.m_row = 0;
      local_208.m_col = 1;
      local_208.m_currentBlockRows = 1;
      local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar10;
      if (local_1e8 < 0.0) {
        dVar3 = sqrt(local_1e8);
      }
      local_1d4 = (float)((double)(fVar11 * fVar19 + fVar1 * local_188) * (-1.0 / dVar3) * dVar22);
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_208,&local_1d4);
      if (local_1e8 < 0.0) {
        dVar5 = sqrt(local_1e8);
      }
      else {
        dVar5 = SQRT(local_1e8);
      }
      local_1d8 = (float)((double)(fVar11 * fVar17 - fVar1 * (float)local_128._0_4_) * (1.0 / dVar5)
                         * dVar22);
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_1d8);
      if (local_1e8 < 0.0) {
        dVar5 = sqrt(local_1e8);
      }
      else {
        dVar5 = SQRT(local_1e8);
      }
      fVar13 = SQRT(fVar13);
      dVar3 = (double)fVar13;
      local_158 = (float)((((-1.0 / dVar5) * dVar22) / dVar3) * dVar23);
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_158);
      local_1c8._0_4_ = -(float)local_1b8._0_4_;
      uStack_1c0 = local_1b8._8_4_ ^ 0x80000000;
      uStack_1bc = local_1b8._12_4_ ^ 0x80000000;
      if (local_1e8 < 0.0) {
        local_1c8 = (double)(local_1b8._0_8_ ^ 0x8000000080000000);
        dVar5 = sqrt(local_1e8);
      }
      else {
        dVar5 = SQRT(local_1e8);
      }
      fVar16 = (float)local_1c8 * fVar1;
      local_1c8 = (double)CONCAT44(local_128._4_4_,(float)local_128._0_4_ * (float)local_a8._0_4_);
      uStack_1c0 = local_128._8_4_;
      uStack_1bc = local_128._12_4_;
      local_15c = (float)((double)((fVar16 + fVar18 * fVar17 + (float)local_198._0_4_ * fVar17) -
                                  (float)local_128._0_4_ * (float)local_a8._0_4_ * fVar19) *
                         (((-1.0 / dVar5) * dVar22) / dVar3));
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_15c);
      dVar5 = local_1e8;
      local_b8 = (float)((uint)local_b8 ^ local_138._0_4_);
      uStack_b4 = uStack_b4 ^ local_138._4_4_;
      uStack_b0 = uStack_b0 ^ local_138._8_4_;
      uStack_ac = uStack_ac ^ local_138._12_4_;
      if (local_1e8 < 0.0) {
        local_1e8 = (double)((ulong)local_1c8 ^ 0x8000000080000000);
        uStack_1e0 = uStack_1c0 ^ 0x80000000;
        uStack_1dc = uStack_1bc ^ 0x80000000;
        dVar5 = sqrt(dVar5);
        fVar16 = local_1e8._0_4_;
      }
      else {
        dVar5 = SQRT(local_1e8);
        fVar16 = -(float)local_1c8;
      }
      local_160 = (float)((double)(fVar16 * fVar17 +
                                  local_b8 * fVar1 + fVar18 * fVar19 + (float)local_1a8 * fVar19) *
                         (((-1.0 / dVar5) * dVar22) / dVar3));
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_160);
      local_164 = fVar11 / fVar13;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_164);
      local_168 = (float)local_128._0_4_ / fVar13;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar6,&local_168);
      local_16c = (float)local_a8._0_4_ / fVar13;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar6,&local_16c);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_208.m_row + local_208.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) || (local_208.m_col != 3))
      goto LAB_001479e4;
      fVar16 = (float)local_1a8 * local_174;
      fVar20 = fVar18 * local_174;
      fVar15 = local_174 * (float)local_198._0_4_;
      fVar11 = fVar11 * local_1d0;
      fVar14 = -(float)local_128._0_4_ * local_1d0;
      fVar12 = local_188 * local_1d0;
      dVar5 = (double)((float)local_1b8._0_4_ * fVar1 * fVar17);
      dVar4 = (double)((float)local_138._0_4_ * fVar1 * fVar19);
      dVar22 = (double)((float)local_1c8 * fVar17 * fVar19);
      dVar5 = (((double)(fVar17 * fVar17 * (float)local_198._0_4_ +
                        fVar19 * fVar19 * (float)local_1a8 +
                        fVar1 * fVar1 * (float)local_198._0_4_ +
                        fVar18 * fVar19 * fVar19 +
                        fVar18 * fVar17 * fVar17 + (float)local_1a8 * fVar1 * fVar1) -
               (dVar5 + dVar5)) - (dVar4 + dVar4)) - (dVar22 + dVar22);
      local_208.m_row = 0;
      local_208.m_col = 1;
      local_208.m_currentBlockRows = 1;
      local_154 = 0.0;
      if (dVar5 < 0.0) {
        local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_154;
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
        local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_154;
      }
      local_1d4 = (float)(((double)(fVar12 * fVar19 +
                                   fVar14 * fVar17 + ((fVar15 + fVar20 + fVar16) - fVar11 * fVar1))
                          * (-1.0 / dVar3)) / dVar5);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_208,
                          &local_1d4);
      local_1d8 = local_1d0 / fVar13;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar7,&local_1d8);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_208.m_row + local_208.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_208.m_col == 1)) {
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [3] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [4] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [5] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [6] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [7] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [8] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [9] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [10] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xb] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xf] = 1.0;
        lVar8 = 0;
        do {
          *(undefined4 *)
           ((long)local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar8 + 8) = *(undefined4 *)(pDVar10 + 8);
          *(undefined8 *)
           ((long)local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar8) = *(undefined8 *)pDVar10;
          pDVar10 = pDVar10 + 0xc;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x30);
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = local_14c;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = fStack_150;
        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = local_154;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar9 = (ostream *)std::ostream::flush();
          poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                            &local_108);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar9 = (ostream *)std::ostream::flush();
          local_208.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_108;
          local_208.m_row = (Index)&local_108;
          poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                             *)&local_208);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
          ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar2,&local_108);
        }
        else {
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 0xc) =
               local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._48_8_;
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xe) =
               CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xf],
                        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xe]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 8) =
               local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._32_8_;
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 10) =
               local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._40_8_;
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 4) =
               CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5],
                        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[4]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 6) =
               local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._24_8_;
          *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                    ).m_storage.m_data.array =
               CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1],
                        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0]);
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 2) =
               CONCAT44(local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3],
                        local_108.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2]);
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
    ;
  }
  else {
LAB_001479e4:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}